

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unzip.c
# Opt level: O1

int unzGoToFilePos(unzFile file,unz_file_pos *file_pos)

{
  int iVar1;
  unz64_file_pos file_pos64;
  unz64_file_pos local_10;
  
  if (file_pos != (unz_file_pos *)0x0) {
    local_10.pos_in_zip_directory = file_pos->pos_in_zip_directory;
    local_10.num_of_file = file_pos->num_of_file;
    iVar1 = unzGoToFilePos64(file,&local_10);
    return iVar1;
  }
  return -0x66;
}

Assistant:

extern int ZEXPORT unzGoToFilePos(
    unzFile file,
    unz_file_pos* file_pos)
{
    unz64_file_pos file_pos64;
    if (file_pos == NULL)
        return UNZ_PARAMERROR;

    file_pos64.pos_in_zip_directory = file_pos->pos_in_zip_directory;
    file_pos64.num_of_file = file_pos->num_of_file;
    return unzGoToFilePos64(file, &file_pos64);
}